

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O0

storage_t *
init_storage(fdb_config *m_fconfig,fdb_config *r_fconfig,fdb_kvs_config *kvs_config,
            idx_prams_t *idxp,checkpoint_t *v_chk,bool walflush)

{
  byte bVar1;
  storage_t *psVar2;
  idx_prams_t *in_RCX;
  checkpoint_t *in_R8;
  byte in_R9B;
  storage_t *st;
  fdb_kvs_config *in_stack_00000170;
  char *in_stack_00000178;
  fdb_kvs_handle **in_stack_00000180;
  fdb_file_handle *in_stack_00000188;
  fdb_config *in_stack_000001e8;
  char *in_stack_000001f0;
  fdb_file_handle **in_stack_000001f8;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R9B & 1;
  psVar2 = (storage_t *)malloc(0x50);
  psVar2->v_chk = in_R8;
  psVar2->index_params = in_RCX;
  psVar2->walflush = (bool)(bVar1 & 1);
  psVar2->verify_set = true;
  gen_random((char *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),(int)((ulong)psVar2 >> 0x20));
  fdb_open(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
  fdb_kvs_open(in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170);
  fdb_kvs_open(in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170);
  fdb_kvs_open(in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170);
  fdb_set_log_callback(psVar2->all_docs,logCallbackFunc,"e2etest:all_docs");
  fdb_set_log_callback(psVar2->index1,logCallbackFunc,"e2etest:index1");
  fdb_set_log_callback(psVar2->index2,logCallbackFunc,"e2etest:index2");
  fdb_open(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
  fdb_kvs_open(in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170);
  fdb_kvs_open(in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170);
  fdb_set_log_callback(psVar2->rtx,logCallbackFunc,"e2etest:rtx");
  fdb_set_log_callback(psVar2->chk,logCallbackFunc,"e2etest:chk");
  return psVar2;
}

Assistant:

storage_t *init_storage(fdb_config *m_fconfig,
                  fdb_config *r_fconfig,
                  fdb_kvs_config *kvs_config,
                  idx_prams_t *idxp, checkpoint_t *v_chk,
                  bool walflush)
{

    storage_t *st = (storage_t *)malloc(sizeof(storage_t));
    st->v_chk = v_chk;
    st->index_params = idxp;
    st->walflush = walflush;
    st->verify_set = true;
    gen_random(st->keyspace, KEYSPACE_LEN);

    // init dbs
    fdb_open(&st->main, E2EDB_MAIN, m_fconfig);
    fdb_kvs_open(st->main, &st->all_docs, E2EKV_ALLDOCS,  kvs_config);
    fdb_kvs_open(st->main, &st->index1, E2EKV_INDEX1,  kvs_config);
    fdb_kvs_open(st->main, &st->index2, E2EKV_INDEX2,  kvs_config);
    fdb_set_log_callback(st->all_docs, logCallbackFunc,
                         (void *) "e2etest:all_docs");
    fdb_set_log_callback(st->index1, logCallbackFunc,
                         (void *) "e2etest:index1");
    fdb_set_log_callback(st->index2, logCallbackFunc,
                         (void *) "e2etest:index2");

    // use unique records db for each storage instance
    fdb_open(&st->records, E2EDB_RECORDS, r_fconfig);
    fdb_kvs_open(st->records, &st->rtx, E2EKV_RECORDS,  kvs_config);
    fdb_kvs_open(st->records, &st->chk, E2EKV_CHECKPOINTS,  kvs_config);
    fdb_set_log_callback(st->rtx, logCallbackFunc, (void *) "e2etest:rtx");
    fdb_set_log_callback(st->chk, logCallbackFunc, (void *) "e2etest:chk");
    return st;
}